

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_advsound.cpp
# Opt level: O1

void S_ClearSoundData(void)

{
  FMusicVolume *block;
  long lVar1;
  ulong uVar2;
  
  S_StopAllChannels();
  if (S_sfx.Count != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      S_UnloadSound((sfxinfo_t *)((long)&((S_sfx.Array)->data).data + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x50;
    } while (uVar2 < S_sfx.Count);
  }
  if (S_sfx.Count != 0) {
    TArray<sfxinfo_t,_sfxinfo_t>::DoDelete(&S_sfx,0,S_sfx.Count - 1);
    S_sfx.Count = 0;
  }
  M_Free(Ambients.Nodes);
  Ambients.Nodes = (Node *)0x0;
  Ambients.LastFree = (Node *)0x0;
  Ambients.Size = 0;
  Ambients.NumUsed = 0;
  TMap<int,_FAmbientSound,_THashTraits<int>,_TValueTraits<FAmbientSound>_>::SetNodeVector
            (&Ambients,1);
  while (block = MusicVolumes, MusicVolumes != (FMusicVolume *)0x0) {
    MusicVolumes = MusicVolumes->Next;
    M_Free(block);
  }
  if (S_rnd.Count != 0) {
    TArray<FRandomSoundList,_FRandomSoundList>::DoDelete(&S_rnd,0,S_rnd.Count - 1);
    S_rnd.Count = 0;
  }
  NumPlayerReserves = 0;
  PlayerClassesIsSorted = 0;
  if (PlayerClassLookups.Count != 0) {
    TArray<FPlayerClassLookup,_FPlayerClassLookup>::DoDelete
              (&PlayerClassLookups,0,PlayerClassLookups.Count - 1);
    PlayerClassLookups.Count = 0;
  }
  if (PlayerSounds.Count != 0) {
    TArray<FPlayerSoundHashTable,_FPlayerSoundHashTable>::DoDelete
              (&PlayerSounds,0,PlayerSounds.Count - 1);
    PlayerSounds.Count = 0;
  }
  DefPlayerClass = 0;
  FString::operator=(&DefPlayerClassName,(char *)"");
  M_Free(MusicAliases.Nodes);
  MusicAliases.Nodes = (Node *)0x0;
  MusicAliases.LastFree = (Node *)0x0;
  MusicAliases.Size = 0;
  MusicAliases.NumUsed = 0;
  TMap<FName,_FName,_THashTraits<FName>,_TValueTraits<FName>_>::SetNodeVector(&MusicAliases,1);
  TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::
  ClearNodeVector(&MidiDevices);
  TMap<FName,_MidiDeviceSetting,_THashTraits<FName>,_TValueTraits<MidiDeviceSetting>_>::
  SetNodeVector(&MidiDevices,1);
  TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::ClearNodeVector(&HexenMusic);
  TMap<int,_FString,_THashTraits<int>,_TValueTraits<FString>_>::SetNodeVector(&HexenMusic,1);
  return;
}

Assistant:

static void S_ClearSoundData()
{
	unsigned int i;

	S_StopAllChannels();
	for (i = 0; i < S_sfx.Size(); ++i)
	{
		S_UnloadSound(&S_sfx[i]);
	}
	S_sfx.Clear();
	Ambients.Clear();
	while (MusicVolumes != NULL)
	{
		FMusicVolume *me = MusicVolumes;
		MusicVolumes = me->Next;
		M_Free(me);
	}
	S_rnd.Clear();

	NumPlayerReserves = 0;
	PlayerClassesIsSorted = false;
	PlayerClassLookups.Clear();
	PlayerSounds.Clear();
	DefPlayerClass = 0;
	DefPlayerClassName = "";
	MusicAliases.Clear();
	MidiDevices.Clear();
	HexenMusic.Clear();
}